

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  sqlite3 *db;
  Expr *pEVar1;
  ExprList *pEVar2;
  ExprList_item *pEVar3;
  char *zName;
  CollSeq *pColl;
  CollSeq *pCVar4;
  u8 uVar5;
  ulong uVar6;
  Expr *pEVar7;
  long lVar8;
  
  db = pParse->db;
LAB_0017b4ea:
  do {
    pEVar7 = pExpr;
    if (pEVar7 == (Expr *)0x0) {
      return (CollSeq *)0x0;
    }
    uVar5 = pEVar7->op;
    if (uVar5 == 0xb0) {
      uVar5 = pEVar7->op2;
    }
    if ((uVar5 == '$') || (uVar5 == 0xae)) {
      pEVar3 = (ExprList_item *)&pEVar7->pLeft;
    }
    else {
      if (uVar5 != 0xb1) {
        if (uVar5 != 'M') {
          if (uVar5 == 'q') {
            pColl = sqlite3GetCollSeq(pParse,db->enc,(CollSeq *)0x0,(pEVar7->u).zToken);
            goto LAB_0017b617;
          }
          if ((uVar5 != 0xa9) && (uVar5 != 0xa7)) {
            if ((pEVar7->flags & 0x200) == 0) {
              return (CollSeq *)0x0;
            }
            pExpr = pEVar7->pLeft;
            if ((pExpr == (Expr *)0x0) || ((pExpr->flags & 0x200) == 0)) {
              pEVar1 = pEVar7->pRight;
              pEVar2 = (pEVar7->x).pList;
              pExpr = pEVar1;
              if ((pEVar2 != (ExprList *)0x0) && (db->mallocFailed == '\0')) {
                uVar6 = (ulong)(uint)pEVar2->nExpr;
                if (pEVar2->nExpr < 1) {
                  uVar6 = 0;
                }
                lVar8 = 0;
                do {
                  pExpr = pEVar1;
                  if (uVar6 * 0x18 + 0x18 == lVar8 + 0x18) break;
                  pExpr = *(Expr **)((long)&pEVar2->a[0].pExpr + lVar8);
                  lVar8 = lVar8 + 0x18;
                } while ((pExpr->flags & 0x200) == 0);
              }
            }
            goto LAB_0017b4ea;
          }
        }
        if ((long)pEVar7->iColumn < 0) {
          return (CollSeq *)0x0;
        }
        zName = sqlite3ColumnColl(((pEVar7->y).pTab)->aCol + pEVar7->iColumn);
        pColl = sqlite3FindCollSeq(db,db->enc,zName,0);
LAB_0017b617:
        if (pColl == (CollSeq *)0x0) {
          return (CollSeq *)0x0;
        }
        if (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
          pCVar4 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName);
          if (pCVar4 == (CollSeq *)0x0) {
            return (CollSeq *)0x0;
          }
          return pColl;
        }
        return pColl;
      }
      pEVar3 = ((pEVar7->x).pList)->a;
    }
    pExpr = pEVar3->pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, const Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  const Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( op==TK_REGISTER ) op = p->op2;
    if( op==TK_AGG_COLUMN || op==TK_COLUMN || op==TK_TRIGGER ){
      int j;
      assert( ExprUseYTab(p) );
      assert( p->y.pTab!=0 );
      if( (j = p->iColumn)>=0 ){
        const char *zColl = sqlite3ColumnColl(&p->y.pTab->aCol[j]);
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(p) );
      p = p->x.pList->a[0].pExpr;
      continue;
    }
    if( op==TK_COLLATE ){
      assert( !ExprHasProperty(p, EP_IntValue) );
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( ExprUseXList(p) );
        assert( p->x.pList==0 || p->pRight==0 );
        if( p->x.pList!=0 && !db->mallocFailed ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){
    pColl = 0;
  }
  return pColl;
}